

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlAttributePtr xmlGetDtdAttrDesc(xmlDtdPtr dtd,xmlChar *elem,xmlChar *name)

{
  xmlHashTablePtr hash;
  xmlChar *key;
  xmlAttributePtr pxVar1;
  xmlChar *prefix;
  xmlChar *local_20;
  
  local_20 = (xmlChar *)0x0;
  if (dtd != (xmlDtdPtr)0x0) {
    if (name == (xmlChar *)0x0) {
      return (xmlAttributePtr)0x0;
    }
    if (elem == (xmlChar *)0x0) {
      return (xmlAttributePtr)0x0;
    }
    hash = (xmlHashTablePtr)dtd->attributes;
    if (hash == (xmlHashTablePtr)0x0) {
      return (xmlAttributePtr)0x0;
    }
    key = xmlSplitQName4(name,&local_20);
    if (key != (xmlChar *)0x0) {
      pxVar1 = (xmlAttributePtr)xmlHashLookup3(hash,key,local_20,elem);
      if (local_20 == (xmlChar *)0x0) {
        return pxVar1;
      }
      (*xmlFree)(local_20);
      return pxVar1;
    }
  }
  return (xmlAttributePtr)0x0;
}

Assistant:

xmlAttributePtr
xmlGetDtdAttrDesc(xmlDtdPtr dtd, const xmlChar *elem, const xmlChar *name) {
    xmlAttributeTablePtr table;
    xmlAttributePtr cur;
    const xmlChar *localname;
    xmlChar *prefix = NULL;

    if ((dtd == NULL) || (dtd->attributes == NULL) ||
        (elem == NULL) || (name == NULL))
        return(NULL);

    table = (xmlAttributeTablePtr) dtd->attributes;
    if (table == NULL)
	return(NULL);

    localname = xmlSplitQName4(name, &prefix);
    if (localname == NULL)
        return(NULL);
    cur = xmlHashLookup3(table, localname, prefix, elem);
    if (prefix != NULL)
        xmlFree(prefix);
    return(cur);
}